

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

void vdebug(char *msg,__va_list_tag *ap)

{
  string buf;
  string local_28;
  
  vdebugmsg_abi_cxx11_(&local_28,msg,ap);
  debugoutput(local_28._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void vdebug(const char *msg, va_list ap)
{
    std::string buf= vdebugmsg(msg, ap);
#ifdef WIN32
    if (g_debugOutputFlags&DBG_WCHAROUTPUT) {
        wdebugoutput(ToWString(buf).c_str());
    }
#endif
    debugoutput(buf.c_str());
}